

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

void NetworkDataType::
     deserializedata<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int>
               (binarydata *data,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,int *args_4
               )

{
  Options OVar1;
  _Ios_Openmode _Var2;
  PortableBinaryInputArchive archive;
  stringstream stream;
  binarydata *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2_00;
  undefined7 in_stack_fffffffffffffd10;
  Options OVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  InputArchive<cereal::PortableBinaryInputArchive,_1U> *in_stack_fffffffffffffd20;
  istream *in_stack_fffffffffffffd28;
  PortableBinaryInputArchive *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [440];
  
  args_2_00 = &local_1d8;
  binarydata::operator_cast_to_string(in_stack_fffffffffffffcf8);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1b8,(string *)args_2_00,_Var2);
  std::__cxx11::string::~string((string *)&local_1d8);
  OVar1 = cereal::PortableBinaryInputArchive::Options::Default();
  OVar3 = OVar1;
  cereal::PortableBinaryInputArchive::PortableBinaryInputArchive
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (Options *)in_stack_fffffffffffffd20);
  cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::operator()
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(OVar3.itsInputEndianness,in_stack_fffffffffffffd10),args_2_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(OVar1.itsInputEndianness,in_stack_fffffffffffffd00),
             (int *)in_stack_fffffffffffffcf8);
  cereal::PortableBinaryInputArchive::~PortableBinaryInputArchive
            ((PortableBinaryInputArchive *)0x35654d);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

static void deserializedata(const binarydata &data, T & ... args){
        std::stringstream stream(data);
        cereal::PortableBinaryInputArchive archive(stream);
        archive(args...);
    }